

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O2

shared_ptr<rcg::Device> rcg::getDevice(char *id,uint64_t timeout)

{
  __type _Var1;
  long lVar2;
  string *__lhs;
  ostream *poVar3;
  int __oflag;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  ulong uVar6;
  int iVar7;
  Interface *this;
  size_t k;
  ulong uVar8;
  size_t k_1;
  shared_ptr<rcg::Device> sVar9;
  shared_ptr<rcg::Device> dev;
  vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_> interf;
  vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> system;
  string devid;
  string interfid;
  
  id[0] = '\0';
  id[1] = '\0';
  id[2] = '\0';
  id[3] = '\0';
  id[4] = '\0';
  id[5] = '\0';
  id[6] = '\0';
  id[7] = '\0';
  id[8] = '\0';
  id[9] = '\0';
  id[10] = '\0';
  id[0xb] = '\0';
  id[0xc] = '\0';
  id[0xd] = '\0';
  id[0xe] = '\0';
  id[0xf] = '\0';
  if ((timeout != 0) && (*(char *)timeout != '\0')) {
    interfid._M_dataplus._M_p = (pointer)&interfid.field_2;
    interfid._M_string_length = 0;
    interfid.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&devid,(char *)timeout,(allocator *)&system);
    this = (Interface *)0x3a;
    lVar2 = std::__cxx11::string::find((char)&devid,0x3a);
    if (lVar2 != -1) {
      std::__cxx11::string::substr((ulong)&system,(ulong)&devid);
      std::__cxx11::string::operator=((string *)&interfid,(string *)&system);
      std::__cxx11::string::~string((string *)&system);
      std::__cxx11::string::substr((ulong)&system,(ulong)&devid);
      this = (Interface *)&system;
      std::__cxx11::string::operator=((string *)&devid,(string *)&system);
      std::__cxx11::string::~string((string *)&system);
    }
    System::getSystems();
    iVar7 = 0;
    uVar6 = 0;
    uVar4 = extraout_RDX;
    while( true ) {
      if ((ulong)((long)system.
                        super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)system.
                        super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar6) break;
      System::open(system.
                   super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6].
                   super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr,(char *)this,
                   (int)uVar4);
      this = (Interface *)
             system.
             super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar6].
             super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      System::getInterfaces(&interf,(System *)this);
      if (interfid._M_string_length == 0) {
        dev.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
        ;
        dev.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        lVar2 = 0;
        uVar8 = 0;
        while( true ) {
          uVar5 = (long)interf.
                        super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)interf.
                        super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4;
          if ((uVar5 <= uVar8) ||
             (dev.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0)) break;
          Interface::open(*(Interface **)
                           ((long)&((interf.
                                     super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>).
                                   _M_ptr + lVar2),(char *)this,(int)uVar5);
          Interface::getDevice
                    ((Interface *)&stack0xffffffffffffffc0,
                     *(char **)((long)&((interf.
                                         super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>
                                       )._M_ptr + lVar2),(uint64_t)devid._M_dataplus._M_p);
          this = (Interface *)&stack0xffffffffffffffc0;
          std::__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)&dev,
                     (__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)
                     &stack0xffffffffffffffc0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
          if (dev.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            this = (Interface *)&dev;
            std::__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)id,
                       (__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)&dev);
            iVar7 = iVar7 + 1;
          }
          Interface::close(*(Interface **)
                            ((long)&((interf.
                                      super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>).
                                    _M_ptr + lVar2),(int)this);
          uVar8 = uVar8 + 1;
          lVar2 = lVar2 + 0x10;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&dev.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      else {
        lVar2 = 0;
        for (uVar8 = 0;
            uVar8 < (ulong)((long)interf.
                                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)interf.
                                  super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4); uVar8 = uVar8 + 1
            ) {
          __lhs = Interface::getID_abi_cxx11_
                            (*(Interface **)
                              ((long)&((interf.
                                        super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar2));
          this = (Interface *)&interfid;
          _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)this);
          if (_Var1) {
            Interface::open(*(Interface **)
                             ((long)&((interf.
                                       super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>)
                                     ._M_ptr + lVar2),(char *)this,__oflag);
            this = *(Interface **)
                    ((long)&((interf.
                              super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->
                            super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr +
                    lVar2);
            Interface::getDevice((Interface *)&dev,(char *)this,(uint64_t)devid._M_dataplus._M_p);
            if (dev.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              this = (Interface *)&dev;
              std::__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)id,
                         (__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)&dev);
              iVar7 = iVar7 + 1;
            }
            Interface::close(*(Interface **)
                              ((long)&((interf.
                                        super__Vector_base<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super___shared_ptr<rcg::Interface,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr + lVar2),(int)this);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&dev.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
            ;
          }
          lVar2 = lVar2 + 0x10;
        }
      }
      System::close(system.
                    super__Vector_base<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar6].
                    super___shared_ptr<rcg::System,_(__gnu_cxx::_Lock_policy)2>._M_ptr,(int)this);
      std::
      vector<std::shared_ptr<rcg::Interface>,_std::allocator<std::shared_ptr<rcg::Interface>_>_>::
      ~vector(&interf);
      uVar6 = uVar6 + 1;
      uVar4 = extraout_RDX_00;
    }
    std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
    ~vector(&system);
    std::__cxx11::string::~string((string *)&devid);
    std::__cxx11::string::~string((string *)&interfid);
    in_RDX._M_pi = extraout_RDX_01;
    if (1 < iVar7) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"ERROR: Finding device \'");
      poVar3 = std::operator<<(poVar3,(char *)timeout);
      poVar3 = std::operator<<(poVar3,"\' through different producers.");
      std::endl<char,std::char_traits<char>>(poVar3);
      std::__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2> *)id);
      in_RDX._M_pi = extraout_RDX_02;
    }
  }
  sVar9.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi
  ;
  sVar9.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)id;
  return (shared_ptr<rcg::Device>)sVar9.super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Device> getDevice(const char *id, uint64_t timeout)
{
  int found=0;
  std::shared_ptr<Device> ret;

  if (id != 0 && *id != '\0')
  {
    // split into interface and device id

    std::string interfid;
    std::string devid=id;

    size_t p=devid.find(':');
    if (p != std::string::npos)
    {
      interfid=devid.substr(0, p);
      devid=devid.substr(p+1);
    }

    // go through all systems

    std::vector<std::shared_ptr<System> > system=System::getSystems();

    for (size_t i=0; i<system.size(); i++)
    {
      system[i]->open();

      // get all interfaces

      std::vector<std::shared_ptr<Interface> > interf=system[i]->getInterfaces();

      if (interfid.size() > 0)
      {
        // if an interface is defined, then only search this interface

        for (size_t k=0; k<interf.size(); k++)
        {
          if (interf[k]->getID() == interfid)
          {
            interf[k]->open();

            std::shared_ptr<Device> dev=interf[k]->getDevice(devid.c_str(), timeout);

            if (dev)
            {
              ret=dev;
              found++;
            }

            interf[k]->close();
          }
        }
      }
      else
      {
        // if interface is not defined, then check all interfaces

        std::shared_ptr<Device> dev;
        for (size_t k=0; k<interf.size() && !dev; k++)
        {
          interf[k]->open();

          dev=interf[k]->getDevice(devid.c_str(), timeout);

          if (dev)
          {
            ret=dev;
            found++;
          }

          interf[k]->close();
        }
      }

      system[i]->close();
    }
  }

  if (found > 1)
  {
    std::cerr << "ERROR: Finding device '" << id << "' through different producers."
              << std::endl;
    ret.reset();
  }

  return ret;
}